

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O0

int libtorrent::anon_unknown_10::line_longer_than(bdecode_node *e,int limit)

{
  type_t tVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  long local_128;
  int64_t val;
  bdecode_node local_110;
  int local_cc;
  undefined1 local_c8 [4];
  int ret_1;
  int local_78;
  int i_1;
  bdecode_node local_68;
  int local_28;
  int local_24;
  int ret;
  int i;
  int line_len;
  int limit_local;
  bdecode_node *e_local;
  
  ret = 0;
  i = limit;
  _line_len = e;
  tVar1 = bdecode_node::type(e);
  switch(tVar1) {
  case none_t:
    ret = ret + 4;
    break;
  case dict_t:
    ret = ret + 4;
    if (i < ret) {
      return -1;
    }
    for (local_78 = 0; iVar3 = local_78, iVar2 = bdecode_node::dict_size(_line_len), iVar3 < iVar2;
        local_78 = local_78 + 1) {
      bdecode_node::dict_at
                ((pair<boost::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
                  *)local_c8,_line_len,local_78);
      sVar4 = boost::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_c8);
      ret = (int)sVar4 + 4 + ret;
      std::pair<boost::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>::
      ~pair((pair<boost::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
             *)local_c8);
      if (i < ret) {
        return -1;
      }
      bdecode_node::dict_at
                ((pair<boost::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
                  *)&val,_line_len,local_78);
      iVar3 = line_longer_than(&local_110,i - ret);
      std::pair<boost::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>::
      ~pair((pair<boost::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
             *)&val);
      if (iVar3 == -1) {
        return -1;
      }
      ret = iVar3 + 1 + ret;
      local_cc = iVar3;
    }
    break;
  case list_t:
    ret = ret + 4;
    if (i < ret) {
      return -1;
    }
    for (local_24 = 0; iVar3 = local_24, iVar2 = bdecode_node::list_size(_line_len), iVar3 < iVar2;
        local_24 = local_24 + 1) {
      bdecode_node::list_at(&local_68,_line_len,local_24);
      iVar3 = line_longer_than(&local_68,i - ret);
      bdecode_node::~bdecode_node(&local_68);
      if (iVar3 == -1) {
        return -1;
      }
      ret = iVar3 + 2 + ret;
      local_28 = iVar3;
    }
    break;
  case string_t:
    iVar3 = bdecode_node::string_length(_line_len);
    ret = iVar3 + 3 + ret;
    break;
  case int_t:
    for (local_128 = bdecode_node::int_value(_line_len); 0 < local_128; local_128 = local_128 / 10)
    {
      ret = ret + 1;
    }
    ret = ret + 2;
  }
  if (i < ret) {
    e_local._4_4_ = -1;
  }
  else {
    e_local._4_4_ = ret;
  }
  return e_local._4_4_;
}

Assistant:

int line_longer_than(bdecode_node const& e, int limit)
	{
		int line_len = 0;
		switch (e.type())
		{
		case bdecode_node::list_t:
			line_len += 4;
			if (line_len > limit) return -1;
			for (int i = 0; i < e.list_size(); ++i)
			{
				int const ret = line_longer_than(e.list_at(i), limit - line_len);
				if (ret == -1) return -1;
				line_len += ret + 2;
			}
			break;
		case bdecode_node::dict_t:
			line_len += 4;
			if (line_len > limit) return -1;
			for (int i = 0; i < e.dict_size(); ++i)
			{
				line_len += 4 + int(e.dict_at(i).first.size());
				if (line_len > limit) return -1;
				int const ret = line_longer_than(e.dict_at(i).second, limit - line_len);
				if (ret == -1) return -1;
				line_len += ret + 1;
			}
			break;
		case bdecode_node::string_t:
			line_len += 3 + e.string_length();
			break;
		case bdecode_node::int_t:
		{
			std::int64_t val = e.int_value();
			while (val > 0)
			{
				++line_len;
				val /= 10;
			}
			line_len += 2;
		}
		break;
		case bdecode_node::none_t:
			line_len += 4;
			break;
		}

		if (line_len > limit) return -1;
		return line_len;
	}